

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall PClassActor::DeriveData(PClassActor *this,PClass *newclass)

{
  double dVar1;
  undefined8 uVar2;
  FName FVar3;
  bool bVar4;
  PType *pPVar5;
  PSymbolTable *this_00;
  
  bVar4 = DObject::IsKindOf((DObject *)newclass,RegistrationInfo.MyClass);
  if (!bVar4) {
    __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                  ,0x119,"virtual void PClassActor::DeriveData(PClass *)");
  }
  FString::operator=((FString *)
                     &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      Symbols.Symbols.Size,&this->Obituary);
  FString::operator=((FString *)
                     &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      Conversions,&this->HitObituary);
  pPVar5 = (PType *)this->BurnHeight;
  *(double *)
   &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Conversions.Most =
       this->DeathHeight;
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.PredType = pPVar5;
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
   &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.VisitNext =
       (this->BloodColor).field_0;
  *(undefined8 *)
   ((long)&newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.VisitNext + 4)
       = *(undefined8 *)&this->GibHealth;
  *(int *)&newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.field_0x7c =
       this->PoisonDamage;
  dVar1 = this->RDFactor;
  newclass[1].super_PStruct.super_PNamedType.Outer = (DObject *)this->FastSpeed;
  *(double *)&newclass[1].super_PStruct.super_PNamedType.TypeName = dVar1;
  newclass[1].super_PStruct.Fields.Array = (PField **)this->CameraHeight;
  FVar3.Index = (this->BloodType).Index;
  newclass[1].super_PStruct.Fields.Most = (this->HowlSound).ID;
  newclass[1].super_PStruct.Fields.Count = FVar3.Index;
  *(int *)&newclass[1].SpecialInits.Array = (this->BloodType2).Index;
  *(int *)((long)&newclass[1].SpecialInits.Array + 4) = (this->BloodType3).Index;
  newclass[1].Pointers = (size_t *)this->distancecheck;
  *(DDropItem **)&newclass[1].SpecialInits.Most = this->DropItems;
  *(bool *)&newclass[1].FlatPointers = this->DontHurtShooter;
  uVar2 = *(undefined8 *)&this->MeleeDamage;
  *(undefined8 *)((long)&newclass[1].FlatPointers + 4) = *(undefined8 *)&this->ExplosionRadius;
  *(undefined8 *)((long)&newclass[1].Defaults + 4) = uVar2;
  *(int *)&newclass[1].field_0xd4 = (this->MissileName).Index;
  newclass[1].ConstructNative = (_func_void_void_ptr *)this->MissileHeight;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator=
            ((TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *)
             &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
              Symbols,&this->VisibleToPlayerClass);
  if (this->DamageFactors != (DmgFactors *)0x0) {
    pPVar5 = (PType *)operator_new(0x18);
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::TMap
              ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)pPVar5);
    newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext = pPVar5;
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::operator=
              ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)pPVar5,
               &this->DamageFactors->
                super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>);
  }
  if (this->PainChances != (PainChanceList *)0x0) {
    this_00 = (PSymbolTable *)operator_new(0x18);
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_00);
    newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
    ParentSymbolTable = this_00;
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_00,this->PainChances
              );
    return;
  }
  return;
}

Assistant:

void PClassActor::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassActor)));
	PClassActor *newa = static_cast<PClassActor *>(newclass);

	newa->Obituary = Obituary;
	newa->HitObituary = HitObituary;
	newa->DeathHeight = DeathHeight;
	newa->BurnHeight = BurnHeight;
	newa->BloodColor = BloodColor;
	newa->GibHealth = GibHealth;
	newa->WoundHealth = WoundHealth;
	newa->PoisonDamage = PoisonDamage;
	newa->FastSpeed = FastSpeed;
	newa->RDFactor = RDFactor;
	newa->CameraHeight = CameraHeight;
	newa->HowlSound = HowlSound;
	newa->BloodType = BloodType;
	newa->BloodType2 = BloodType2;
	newa->BloodType3 = BloodType3;
	newa->distancecheck = distancecheck;

	newa->DropItems = DropItems;

	newa->DontHurtShooter = DontHurtShooter;
	newa->ExplosionRadius = ExplosionRadius;
	newa->ExplosionDamage = ExplosionDamage;
	newa->MeleeDamage = MeleeDamage;
	newa->MeleeSound = MeleeSound;
	newa->MissileName = MissileName;
	newa->MissileHeight = MissileHeight;

	newa->VisibleToPlayerClass = VisibleToPlayerClass;

	if (DamageFactors != NULL)
	{
		// copy damage factors from parent
		newa->DamageFactors = new DmgFactors;
		*newa->DamageFactors = *DamageFactors;
	}
	if (PainChances != NULL)
	{
		// copy pain chances from parent
		newa->PainChances = new PainChanceList;
		*newa->PainChances = *PainChances;
	}

}